

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

uint_t flexfloat_pack_bits(flexfloat_desc_t desc,uint_t bits)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  uint_t uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  bVar3 = desc.frac_bits;
  bVar2 = desc.exp_bits;
  uVar10 = 1L << (bVar2 + bVar3 & 0x3f);
  uVar8 = (uint)(bits >> (bVar3 & 0x3f)) & ~(-1 << (bVar2 & 0x1f));
  uVar9 = (ulong)uVar8;
  uVar11 = 1L << (bVar3 & 0x3f);
  uVar1 = uVar11 - 1;
  uVar4 = uVar1 & bits;
  if (uVar9 == 0 && uVar4 == 0) {
    uVar5 = (ulong)((uVar10 & bits) != 0) << 0x3f;
  }
  else {
    if (uVar9 == 0) {
      while (uVar4 != 0) {
        uVar4 = uVar4 * 2;
        if ((uVar4 & uVar11) != 0) goto LAB_0012c792;
        uVar9 = uVar9 - 1;
      }
      uVar4 = 0;
LAB_0012c792:
      lVar7 = 0x7ff0000000000000;
      if ((-1L << (bVar2 & 0x3f) ^ uVar9) != 0xffffffffffffffff) {
        lVar7 = ((ulong)((int)(-1L << (bVar2 - 1 & 0x3f)) + (int)uVar9 + 1) << 0x34) +
                0x3ff0000000000000;
      }
      lVar6 = ((uVar4 & uVar1) << (0x34 - bVar3 & 0x3f)) + ((ulong)((uVar10 & bits) != 0) << 0x3f);
    }
    else {
      lVar7 = 0x7ff0000000000000;
      if ((-1L << (bVar2 & 0x3f) ^ uVar9) != 0xffffffffffffffff) {
        lVar7 = ((ulong)(uVar8 + (int)(-1L << (bVar2 - 1 & 0x3f)) + 1) << 0x34) + 0x3ff0000000000000
        ;
      }
      lVar6 = (uVar4 << (0x34 - bVar3 & 0x3f)) + ((ulong)((uVar10 & bits) != 0) << 0x3f);
    }
    uVar5 = lVar6 + lVar7;
  }
  return uVar5;
}

Assistant:

uint_t flexfloat_pack_bits(flexfloat_desc_t desc, uint_t bits)
{
    bool sign = (bits >> (desc.exp_bits + desc.frac_bits)) & 0x1;
    int_fast16_t exp = (bits >> desc.frac_bits) & ((0x1<<desc.exp_bits) - 1);
    uint_t frac = bits & ((UINT_C(1)<<desc.frac_bits) - 1);

    if(exp == 0 && frac == 0)
    {
        return PACK(sign, 0, 0);
    }
    else if(exp <= 0) // denormal
    {
        // printf("[ff_pack_bits] normalizing 0x%016lx, exp %d\n", frac, exp);
        while (frac && !((frac <<= 1) & (UINT_C(1) << desc.frac_bits))) // normalize
            exp--;
        frac &= ((UINT_C(1) << desc.frac_bits) - 1); // remove implicit bit
        // printf("[ff_pack_bits] done normalizing 0x%016lx, exp %d\n", frac, exp);
        return flexfloat_pack(desc, sign, exp, frac);
    }
    else
    {
        return flexfloat_pack(desc, sign, exp, frac);
    }
}